

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O0

void printPrefetchOp(MCInst *MI,uint OpNum,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  MCOperand *op;
  int64_t iVar3;
  char *s;
  char *Name;
  _Bool Valid;
  SStream *pSStack_20;
  uint prfop;
  SStream *O_local;
  MCInst *pMStack_10;
  uint OpNum_local;
  MCInst *MI_local;
  
  pSStack_20 = O;
  O_local._4_4_ = OpNum;
  pMStack_10 = MI;
  op = MCInst_getOperand(MI,OpNum);
  iVar3 = MCOperand_getImm(op);
  Name._4_4_ = (uint32_t)iVar3;
  s = A64NamedImmMapper_toString(&A64PRFM_PRFMMapper,Name._4_4_,(_Bool *)((long)&Name + 3));
  if ((Name._3_1_ & 1) == 0) {
    printInt32Bang(pSStack_20,Name._4_4_);
    if (pMStack_10->csh->detail != CS_OPT_OFF) {
      puVar1 = pMStack_10->flat_insn->detail->groups +
               (ulong)(pMStack_10->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x2e;
      puVar1[0] = '\x02';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      *(ulong *)(pMStack_10->flat_insn->detail->groups +
                (ulong)(pMStack_10->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x36) =
           (ulong)Name._4_4_;
      pcVar2 = pMStack_10->flat_insn->detail;
      (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
    }
  }
  else {
    SStream_concat0(pSStack_20,s);
    if (pMStack_10->csh->detail != CS_OPT_OFF) {
      puVar1 = pMStack_10->flat_insn->detail->groups +
               (ulong)(pMStack_10->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x2e;
      puVar1[0] = 'E';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      *(uint32_t *)
       (pMStack_10->flat_insn->detail->groups +
       (ulong)(pMStack_10->flat_insn->detail->field_6).x86.opcode[2] * 0x30 + 0x36) = Name._4_4_ + 1
      ;
      pcVar2 = pMStack_10->flat_insn->detail;
      (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
    }
  }
  return;
}

Assistant:

static void printPrefetchOp(MCInst *MI, unsigned OpNum, SStream *O)
{
	unsigned prfop = (unsigned)MCOperand_getImm(MCInst_getOperand(MI, OpNum));
	bool Valid;
	char *Name = A64NamedImmMapper_toString(&A64PRFM_PRFMMapper, prfop, &Valid);

	if (Valid) {
		SStream_concat0(O, Name);
		if (MI->csh->detail) {
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_PREFETCH;
			// we have to plus 1 to prfop because 0 is a valid value of prfop
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].prefetch = prfop + 1;
			MI->flat_insn->detail->arm64.op_count++;
		}
	} else {
		printInt32Bang(O, prfop);
		if (MI->csh->detail) {
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = prfop;
			MI->flat_insn->detail->arm64.op_count++;
		}
	}
}